

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O1

void ssort2(string *a,int n,int depth)

{
  string *ppuVar1;
  undefined8 uVar2;
  string puVar3;
  ulong uVar4;
  string *ppuVar5;
  string *ppuVar6;
  string *ppuVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  string *c;
  string puVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  
  uVar18 = (ulong)(uint)n;
  lVar19 = (long)depth;
LAB_0025192c:
  uVar8 = (uint)uVar18;
  if (9 < (int)uVar8) {
    ppuVar6 = a + (uVar18 >> 1 & 0x7fffffff);
    uVar4 = uVar18 & 0xffffffff;
    c = a + (uVar4 - 1);
    ppuVar7 = c;
    ppuVar5 = a;
    if (0x1e < (int)uVar8) {
      uVar18 = (ulong)(uVar8 & 0xfffffff8);
      uVar17 = (ulong)(uVar8 >> 2 & 0xfffffffe);
      ppuVar5 = med3func(a,(string *)((long)a + uVar18),a + uVar17,depth);
      ppuVar6 = med3func((string *)((long)ppuVar6 - uVar18),ppuVar6,
                         (string *)((long)ppuVar6 + uVar18),depth);
      ppuVar7 = med3func(c + -uVar17,(string *)((long)c - uVar18),c,depth);
    }
    ppuVar6 = med3func(ppuVar5,ppuVar6,ppuVar7,depth);
    puVar11 = *a;
    *a = *ppuVar6;
    *ppuVar6 = puVar11;
    bVar15 = (*a)[lVar19];
    ppuVar6 = a + 1;
    ppuVar7 = c;
    ppuVar5 = ppuVar6;
    do {
      for (; ppuVar6 <= ppuVar7; ppuVar6 = ppuVar6 + 1) {
        bVar13 = (*ppuVar6)[lVar19];
        if (bVar15 < bVar13) break;
        if (bVar13 == bVar15) {
          puVar11 = *ppuVar5;
          *ppuVar5 = *ppuVar6;
          *ppuVar6 = puVar11;
          ppuVar5 = ppuVar5 + 1;
        }
      }
      if (ppuVar7 < ppuVar6) goto LAB_00251a87;
      puVar11 = *ppuVar7;
      bVar13 = puVar11[lVar19];
      while (bVar15 <= bVar13) {
        if (bVar13 == bVar15) {
          *ppuVar7 = *c;
          *c = puVar11;
          c = c + -1;
        }
        ppuVar1 = ppuVar7 + -1;
        if (ppuVar1 < ppuVar6) {
          ppuVar7 = ppuVar7 + -1;
          goto LAB_00251a87;
        }
        puVar11 = *ppuVar1;
        ppuVar7 = ppuVar1;
        bVar13 = puVar11[lVar19];
      }
      if (ppuVar7 < ppuVar6) goto LAB_00251a87;
      puVar11 = *ppuVar6;
      *ppuVar6 = *ppuVar7;
      *ppuVar7 = puVar11;
      ppuVar6 = ppuVar6 + 1;
      ppuVar7 = ppuVar7 + -1;
    } while( true );
  }
  ppuVar6 = a;
  if (1 < (int)uVar8) {
    do {
      for (ppuVar7 = ppuVar6 + 1; a < ppuVar7; ppuVar7 = ppuVar7 + -1) {
        puVar11 = ppuVar7[-1];
        puVar3 = *ppuVar7;
        bVar15 = puVar11[lVar19];
        bVar13 = puVar3[lVar19];
        lVar10 = lVar19;
        if (bVar15 != 0 && bVar15 == bVar13) {
          do {
            lVar10 = lVar10 + 1;
            bVar15 = puVar11[lVar10];
            bVar13 = puVar3[lVar10];
            if (bVar15 == 0) break;
          } while (bVar15 == bVar13);
        }
        if (bVar15 <= bVar13) break;
        *ppuVar7 = puVar11;
        ppuVar7[-1] = puVar3;
      }
      iVar9 = (int)uVar18;
      uVar18 = (ulong)(iVar9 - 1);
      ppuVar6 = ppuVar6 + 1;
    } while (2 < iVar9);
  }
  return;
LAB_00251a87:
  lVar10 = (long)ppuVar5 - (long)a >> 3;
  lVar12 = (long)ppuVar6 - (long)ppuVar5 >> 3;
  if (lVar12 <= lVar10) {
    lVar10 = lVar12;
  }
  uVar8 = (uint)lVar10;
  if (0 < (int)uVar8) {
    iVar9 = uVar8 + 1;
    lVar10 = 0;
    do {
      uVar2 = *(undefined8 *)((long)a + lVar10);
      *(undefined8 *)((long)a + lVar10) =
           *(undefined8 *)((long)ppuVar6 + lVar10 + (ulong)(uVar8 & 0x7fffffff) * -8);
      *(undefined8 *)((long)ppuVar6 + lVar10 + (ulong)(uVar8 & 0x7fffffff) * -8) = uVar2;
      lVar10 = lVar10 + 8;
      iVar9 = iVar9 + -1;
    } while (1 < iVar9);
  }
  uVar18 = (long)c - (long)ppuVar7 >> 3;
  lVar10 = (long)((long)a + (uVar4 * 8 - (long)c)) >> 3;
  uVar16 = (uint)uVar18;
  uVar8 = (int)lVar10 - 1;
  if ((long)uVar18 < lVar10) {
    uVar8 = uVar16;
  }
  if (0 < (int)uVar8) {
    lVar10 = (ulong)(uVar8 & 0x7fffffff) * -8 + uVar4 * 8;
    iVar9 = uVar8 + 1;
    lVar14 = 0;
    do {
      uVar2 = *(undefined8 *)((long)ppuVar6 + lVar14);
      *(undefined8 *)((long)ppuVar6 + lVar14) = *(undefined8 *)((long)a + lVar14 + lVar10);
      *(undefined8 *)((long)a + lVar14 + lVar10) = uVar2;
      lVar14 = lVar14 + 8;
      iVar9 = iVar9 + -1;
    } while (1 < iVar9);
  }
  if (1 < (int)lVar12) {
    ssort2(a,(int)lVar12,depth);
  }
  iVar9 = (int)((ulong)((long)ppuVar6 - (long)ppuVar5) >> 3);
  if (a[iVar9][lVar19] != '\0') {
    ssort2(a + iVar9,(int)((long)a + ((((long)ppuVar5 - (long)a) + uVar4 * 8) - (long)c) >> 3) + -1,
           depth + 1);
  }
  if ((int)uVar16 < 2) {
    return;
  }
  a = a + (uVar4 - (uVar16 & 0x7fffffff));
  goto LAB_0025192c;
}

Assistant:

static void ssort2(string a[], int n, int depth)
{   int d, r, partval;
    string *pa, *pb, *pc, *pd, *pl, *pm, *pn, t;
    if (n < 10) {
        insertsort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
        }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        ssort2(a, r, depth);
    if (ptr2char(a + r) != 0)
        ssort2(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        ssort2(a + n-r, r, depth);
}